

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small.c
# Opt level: O2

void * smalloc(small_alloc *alloc,size_t size)

{
  rlist *prVar1;
  size_t *psVar2;
  small_mempool *pool;
  small_mempool_group *psVar3;
  mslab *slab;
  rlist *prVar4;
  rlist *prVar5;
  small_mempool *small_mempool;
  slab *psVar6;
  slab *psVar7;
  long lVar8;
  ulong uVar9;
  small_mempool *small_mempool_00;
  small_mempool *psVar10;
  uint i;
  
  small_mempool = small_mempool_search(alloc,size);
  if (small_mempool == (small_mempool *)0x0) {
    psVar7 = slab_get_large(alloc->cache,size);
    psVar6 = psVar7 + 1;
    if (psVar7 == (slab *)0x0) {
      psVar6 = (slab *)0x0;
    }
  }
  else {
    pool = small_mempool->used_pool;
    if ((pool->pool).objsize < size) {
      __assert_fail("size <= pool->objsize",
                    "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]small/small/small.c"
                    ,0x155,"void *smalloc(struct small_alloc *, size_t)");
    }
    psVar6 = (slab *)mempool_alloc(&pool->pool);
    if (psVar6 == (slab *)0x0) {
      small_mempool_00 = alloc->small_mempool_cache;
      psVar10 = small_mempool_00;
      for (uVar9 = 0; uVar9 < alloc->small_mempool_cache_size; uVar9 = uVar9 + 1) {
        psVar3 = small_mempool_00->group;
        lVar8 = ((long)psVar10 - (long)psVar3->first) / 0x98;
        if (((((psVar3->active_pool_mask >> ((uint)lVar8 & 0x1f) & 1) != 0) &&
             ((small_mempool_00->pool).slabs.stats.used < (ulong)(small_mempool_00->pool).objsize))
            && (small_mempool_00->waste < psVar3->waste_max >> 2)) &&
           (small_mempool_00 != psVar3->last)) {
          psVar3->active_pool_mask = psVar3->active_pool_mask & ~(1 << ((byte)lVar8 & 0x1f));
          small_mempool_update_group(small_mempool_00);
          slab = (small_mempool_00->pool).spare;
          if (slab != (mslab *)0x0) {
            prVar1 = &(slab->slab).next_in_list;
            prVar4 = (slab->slab).next_in_list.prev;
            prVar5 = (slab->slab).next_in_list.next;
            prVar4->next = prVar5;
            prVar5->prev = prVar4;
            (slab->slab).next_in_list.next = prVar1;
            (slab->slab).next_in_list.prev = prVar1;
            psVar2 = &(small_mempool_00->pool).slabs.stats.total;
            *psVar2 = *psVar2 - (slab->slab).size;
            slab_put_with_order((small_mempool_00->pool).cache,&slab->slab);
            (small_mempool_00->pool).spare = (mslab *)0x0;
          }
        }
        small_mempool_00 = small_mempool_00 + 1;
        psVar10 = psVar10 + 1;
      }
      psVar6 = (slab *)mempool_alloc(&pool->pool);
      if (psVar6 == (slab *)0x0) {
        return (void *)0x0;
      }
    }
    if ((small_mempool->used_pool != small_mempool) &&
       (uVar9 = (ulong)((small_mempool->used_pool->pool).objsize - (small_mempool->pool).objsize) +
                small_mempool->waste, small_mempool->waste = uVar9,
       small_mempool->group->waste_max <= uVar9)) {
      small_mempool_activate(small_mempool);
    }
  }
  return psVar6;
}

Assistant:

void *
smalloc(struct small_alloc *alloc, size_t size)
{
	struct small_mempool *small_mempool = small_mempool_search(alloc, size);
	if (small_mempool == NULL) {
		/* Object is too large, fallback to slab_cache */
		struct slab *slab = slab_get_large(alloc->cache, size);
		if (slab == NULL)
			return NULL;
		return slab_data(slab);
	}
	struct mempool *pool = &small_mempool->used_pool->pool;
	assert(size <= pool->objsize);
	void *ptr = mempool_alloc(pool);
	if (ptr == NULL) {
		/*
		 * In case we run out of memory let's try to deactivate some
		 * pools and release their sparse slabs. It might not help tho.
		 */
		small_mempool_group_sweep_sparse(alloc);
		ptr = mempool_alloc(pool);
	}

	if (ptr != NULL && small_mempool->used_pool != small_mempool) {
		/*
		 * Waste for this allocation is the difference between
		 * the size of objects optimal (i.e. best-fit) mempool and
		 * used mempool.
		 */
		small_mempool->waste +=
			(small_mempool->used_pool->pool.objsize -
			 small_mempool->pool.objsize);
		/*
		 * In case when waste for this mempool becomes greater than
		 * or equal to waste_max, we are updating the information
		 * for the mempool group that this mempool belongs to,
		 * that it can now be used for memory allocation.
		 */
		if (small_mempool->waste >= small_mempool->group->waste_max)
			small_mempool_activate(small_mempool);
	}

	return ptr;
}